

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

int dpfb::readDeviceAdjsutment(Stream *stream,int pxSize)

{
  long lVar1;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  StreamError *this;
  uint local_70;
  int value;
  int mask;
  int u16rshift;
  uint16_t u16;
  int valueU16Idx;
  int valueIdx;
  int valuesPerU16;
  int valueBits;
  uint16_t deltaFormat;
  string local_40 [32];
  ushort local_20;
  ushort local_1e;
  int local_1c;
  uint16_t endSize;
  uint16_t startSize;
  int pxSize_local;
  Stream *stream_local;
  
  local_1c = pxSize;
  _endSize = stream;
  local_1e = streams::Stream::readU16Be(stream);
  local_20 = streams::Stream::readU16Be(_endSize);
  if (local_20 < local_1e) {
    this = (StreamError *)__cxa_allocate_exception(0x10);
    str::format_abi_cxx11_
              ((char *)local_40,"Device table start size (%u) > end size (%u)",(ulong)local_1e,
               (ulong)local_20);
    streams::StreamError::runtime_error(this,local_40);
    __cxa_throw(this,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
  }
  if ((local_1c < (int)(uint)local_1e) || ((int)(uint)local_20 < local_1c)) {
    stream_local._4_4_ = 0;
  }
  else {
    uVar3 = streams::Stream::readU16Be(_endSize);
    if ((uVar3 == 0) || (3 < uVar3)) {
      stream_local._4_4_ = 0;
    }
    else {
      iVar4 = 1 << ((byte)uVar3 & 0x1f);
      lVar1 = 0x10 / (long)iVar4;
      iVar5 = local_1c - (uint)local_1e;
      iVar6 = iVar5 / (int)lVar1;
      (*_endSize->_vptr_Stream[7])(_endSize,(long)iVar6 << 1,1);
      uVar3 = streams::Stream::readU16Be(_endSize);
      cVar2 = (char)iVar4;
      uVar7 = 0xff >> (8U - cVar2 & 0x1f);
      local_70 = (int)(uint)uVar3 >>
                 (((((char)iVar6 + '\x01') * (char)lVar1 + -1) - (char)iVar5) * cVar2 & 0x1fU) &
                 uVar7;
      if ((int)(uVar7 + 1) >> 1 <= (int)local_70) {
        local_70 = local_70 - (uVar7 + 1);
      }
      stream_local._4_4_ = local_70;
    }
  }
  return stream_local._4_4_;
}

Assistant:

static int readDeviceAdjsutment(Stream& stream, int pxSize)
{
    const auto startSize = stream.readU16Be();
    const auto endSize = stream.readU16Be();
    if (startSize > endSize)
        throw StreamError(str::format(
            "Device table start size (%" PRIu16 ") > "
            "end size (%" PRIu16 ")",
            startSize,
            endSize));

    if (pxSize < startSize || pxSize > endSize)
        return 0;

    const auto deltaFormat = stream.readU16Be();
    if (deltaFormat < 1 || deltaFormat > 3)
        return 0;

    const auto valueBits = 1 << deltaFormat;
    const auto valuesPerU16 = 16 / valueBits;
    const auto valueIdx = pxSize - startSize;
    const auto valueU16Idx = valueIdx / valuesPerU16;
    stream.seek(valueU16Idx * sizeof(std::uint16_t), SeekOrigin::cur);

    const auto u16 = stream.readU16Be();
    const auto u16rshift = (
        ((valueU16Idx + 1) * valuesPerU16 - 1 - valueIdx) * valueBits);
    const auto mask = 0xff >> (8 - valueBits);

    int value = (u16 >> u16rshift) & mask;
    if (value >= (mask + 1) >> 1)
        value -= mask + 1;

    return value;
}